

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_ftint_s_df_mipsel(CPUMIPSState_conflict4 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  int32_t *piVar1;
  float_status *pfVar2;
  fpr_t *pfVar3;
  long lVar4;
  uint uVar5;
  int32_t iVar6;
  float32 fVar7;
  int64_t iVar8;
  float64 fVar9;
  ulong uVar10;
  long lVar11;
  float_status *status;
  uintptr_t unaff_retaddr;
  wr_t wx;
  
  lVar4 = (ulong)ws * 0x10 + 0x228;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      iVar6 = float32_to_int32_mipsel
                        (*(float32 *)((long)(env->active_fpu).fpr + lVar11 * 4 + lVar4 + -0x228),
                         pfVar2);
      *(int32_t *)((long)&wx + lVar11 * 4) = iVar6;
      uVar5 = update_msacsr(env,1,0);
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) == 0) {
        uVar5 = 0;
        if (0x7f800000 <
            (*(uint *)((long)(env->active_fpu).fpr + lVar11 * 4 + lVar4 + -0x228) & 0x7fffffff))
        goto LAB_007586b3;
      }
      else {
        fVar7 = float32_default_nan_mipsel(pfVar2);
        uVar5 = fVar7 & 0xffffffc0 ^ 0x400000 | uVar5;
LAB_007586b3:
        *(uint *)((long)&wx + lVar11 * 4) = uVar5;
      }
    }
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1c95,
                    "void helper_msa_ftint_s_df_mipsel(CPUMIPSState *, uint32_t, uint32_t, uint32_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      iVar8 = float64_to_int64_mipsel
                        (*(float64 *)((long)(env->active_fpu).fpr + lVar11 * 8 + lVar4 + -0x228),
                         pfVar2);
      *(int64_t *)((long)&wx + lVar11 * 8) = iVar8;
      uVar5 = update_msacsr(env,1,0);
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) == 0) {
        if (0x7ff0000000000000 <
            (*(ulong *)((long)(env->active_fpu).fpr + lVar11 * 8 + lVar4 + -0x228) &
            0x7fffffffffffffff)) {
          uVar10 = 0;
          goto LAB_0075862c;
        }
      }
      else {
        fVar9 = float64_default_nan_mipsel(pfVar2);
        uVar10 = (long)(int)uVar5 | fVar9 & 0xffffffffffffffc0 ^ 0x8000000000000;
LAB_0075862c:
        *(ulong *)((long)&wx + lVar11 * 8) = uVar10;
      }
    }
  }
  check_msacsr_cause(env,unaff_retaddr);
  pfVar3 = (env->active_fpu).fpr + wd;
  pfVar3->fd = wx.d[0];
  (&pfVar3->fd)[1] = wx.d[1];
  return;
}

Assistant:

void helper_msa_ftint_s_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                           uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_UNOP0(pwx->w[i], to_int32, pws->w[i], 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP0(pwx->d[i], to_int64, pws->d[i], 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}